

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTElements.hpp
# Opt level: O2

string * __thiscall FieldType::getName_abi_cxx11_(string *__return_storage_ptr__,FieldType *this)

{
  pointer pFVar1;
  pointer this_00;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  if ((this->templateTypes).super__Vector_base<FieldType,_std::allocator<FieldType>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->templateTypes).super__Vector_base<FieldType,_std::allocator<FieldType>_>._M_impl.
      super__Vector_impl_data._M_start) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pFVar1 = (this->templateTypes).super__Vector_base<FieldType,_std::allocator<FieldType>_>._M_impl
             .super__Vector_impl_data._M_finish;
    for (this_00 = (this->templateTypes).super__Vector_base<FieldType,_std::allocator<FieldType>_>.
                   _M_impl.super__Vector_impl_data._M_start; this_00 != pFVar1;
        this_00 = this_00 + 1) {
      getName_abi_cxx11_(&local_70,this_00);
      std::operator+(&local_50,&local_70,", ");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::__cxx11::string::pop_back();
    std::__cxx11::string::pop_back();
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getName() {
        std::string result = name;
        if (this->templateTypes.size()) {
            result += "<";
            for (auto& itr : this->templateTypes) {
                result += itr.getName() + ", ";
            }
            result.pop_back();
            result.pop_back();
            result += ">";
        }
        return result;
    }